

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

ostream * mjs::operator<<(ostream *os,string *s)

{
  uint *puVar1;
  ostream *poVar2;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  puVar1 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)s);
  local_38 = local_28;
  std::__cxx11::string::_M_construct<wchar_t_const*>
            ((string *)&local_38,puVar1 + 1,puVar1 + (ulong)*puVar1 + 1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const string& s) {
    auto v = s.view();
    return os << std::string(v.begin(), v.end());
}